

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

ostream * __thiscall
trompeloeil::
call_matcher<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
::report_signature(call_matcher<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
                   *this,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  call_matcher<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
  *this_local;
  
  poVar1 = std::operator<<(os,(this->
                              super_call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ).name);
  poVar1 = std::operator<<(poVar1," at ");
  poVar1 = trompeloeil::operator<<
                     (poVar1,&(this->
                              super_call_matcher_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ).loc);
  return poVar1;
}

Assistant:

std::ostream&
    report_signature(
      std::ostream& os)
    const override
    {
      return os << name << " at " << loc;
    }